

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptArray::GetPropertyBuiltIns(JavascriptArray *this,PropertyId propertyId,Var *value)

{
  Var pvVar1;
  
  if (propertyId == 0xd1) {
    pvVar1 = JavascriptNumber::ToVar
                       ((this->super_ArrayObject).length,
                        (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                            type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                        scriptContext.ptr);
    *value = pvVar1;
  }
  return (uint)(propertyId == 0xd1);
}

Assistant:

BOOL JavascriptArray::GetPropertyBuiltIns(PropertyId propertyId, Var* value)
    {
        //
        // length being accessed. Return array length
        //
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), GetScriptContext());
            return true;
        }

        return false;
    }